

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEnc_AllocAndInit
               (CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  CMatchFinder *p_00;
  size_t sVar1;
  UInt32 UVar2;
  int iVar3;
  Byte *pBVar4;
  UInt16 *pUVar5;
  byte bVar6;
  uint uVar7;
  SRes SVar8;
  
  UVar2 = 0;
  for (bVar6 = 0; (UVar2 != 0x3e && ((uint)(1 << (bVar6 & 0x1f)) < p->dictSize)); bVar6 = bVar6 + 1)
  {
    UVar2 = UVar2 + 2;
  }
  p->distTableSize = UVar2;
  p->finished = 0;
  p->result = 0;
  if ((p->rc).bufBase == (Byte *)0x0) {
    pBVar4 = (Byte *)(*alloc->Alloc)(alloc,0x10000);
    (p->rc).bufBase = pBVar4;
    if (pBVar4 == (Byte *)0x0) {
      return 2;
    }
    (p->rc).bufLim = pBVar4 + 0x10000;
  }
  uVar7 = p->lp + p->lc;
  if (((p->litProbs == (UInt16 *)0x0) || ((p->saveState).litProbs == (UInt16 *)0x0)) ||
     (p->lclp != uVar7)) {
    LzmaEnc_FreeLits(p,alloc);
    sVar1 = (long)(0x300 << ((byte)uVar7 & 0x1f)) * 2;
    pUVar5 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
    p->litProbs = pUVar5;
    pUVar5 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
    (p->saveState).litProbs = pUVar5;
    if ((pUVar5 == (UInt16 *)0x0) || (p->litProbs == (UInt16 *)0x0)) {
      LzmaEnc_FreeLits(p,alloc);
      return 2;
    }
    p->lclp = uVar7;
  }
  SVar8 = 2;
  uVar7 = p->dictSize;
  p_00 = &p->matchFinderBase;
  (p->matchFinderBase).bigHash = (uint)(0x1000000 < uVar7);
  UVar2 = keepWindowSize - uVar7;
  if (keepWindowSize <= uVar7 + 0x1000) {
    UVar2 = 0x1000;
  }
  iVar3 = MatchFinder_Create(p_00,uVar7,UVar2,p->numFastBytes,0x111,allocBig);
  if (iVar3 != 0) {
    p->matchFinderObj = p_00;
    MatchFinder_CreateVTable(p_00,&p->matchFinder);
    LzmaEnc_Init(p);
    LzmaEnc_InitPrices(p);
    p->nowPos64 = 0;
    SVar8 = 0;
  }
  return SVar8;
}

Assistant:

static SRes LzmaEnc_AllocAndInit(CLzmaEnc* p, UInt32 keepWindowSize, ISzAlloc* alloc, ISzAlloc* allocBig) {
  UInt32 i;
  for (i = 0; i < (UInt32)kDicLogSizeMaxCompress; i++)
    if (p->dictSize <= ((UInt32)1 << i))
      break;
  p->distTableSize = i * 2;

  p->finished = False;
  p->result = SZ_OK;
  RINOK(LzmaEnc_Alloc(p, keepWindowSize, alloc, allocBig));
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return SZ_OK;
}